

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc.c
# Opt level: O3

int evfilt_proc_copyout(kevent *dst,int nevents,filter *filt,knote *src,void *ptr)

{
  byte *pbVar1;
  uintptr_t uVar2;
  void *pvVar3;
  short sVar4;
  unsigned_short uVar5;
  int iVar6;
  uint uVar7;
  ushort uVar8;
  siginfo_t info;
  siginfo_t sStack_98;
  
  uVar2 = (src->kev).ident;
  sVar4 = (src->kev).filter;
  uVar5 = (src->kev).flags;
  uVar7 = (src->kev).fflags;
  pvVar3 = (src->kev).udata;
  dst->data = (src->kev).data;
  dst->udata = pvVar3;
  dst->ident = uVar2;
  dst->filter = sVar4;
  dst->flags = uVar5;
  dst->fflags = uVar7;
  iVar6 = waitid(P_PID,(__id_t)(src->kev).ident,&sStack_98,0x1000005);
  if (iVar6 < 0) {
    uVar7 = 0xffffffff;
  }
  else {
    if (sStack_98.si_code == 3) {
      uVar7 = sStack_98._sifields._pad[2] & 0xffU | 0x80;
    }
    else if (sStack_98.si_code == 2) {
      uVar7 = sStack_98._sifields._pad[2] & 0x7f;
    }
    else {
      if (sStack_98.si_code != 1) {
        return 0;
      }
      uVar7 = sStack_98._sifields._pad[2] << 8;
    }
    dst->data = (ulong)uVar7;
    pbVar1 = (byte *)((long)&dst->flags + 1);
    *pbVar1 = *pbVar1 | 0x80;
    uVar8 = (src->kev).flags;
    iVar6 = 0;
    if ((char)uVar8 < '\0') {
      iVar6 = knote_disable(filt,src);
      uVar8 = (src->kev).flags;
    }
    if ((uVar8 & 0x10) != 0) {
      iVar6 = knote_delete(filt,src);
    }
    uVar7 = iVar6 >> 0x1f | 1;
  }
  return uVar7;
}

Assistant:

int
evfilt_proc_copyout(struct kevent *dst, UNUSED int nevents, struct filter *filt,
    struct knote *src, UNUSED_NDEBUG void *ptr)
{
    siginfo_t info;
    unsigned int status = 0;
#ifndef NDEBUG
    struct epoll_event * const ev = (struct epoll_event *) ptr;
#endif

    dbg_printf("epoll_ev=%s", epoll_event_dump(ev));
    memcpy(dst, &src->kev, sizeof(*dst)); /* Populate flags from the src kevent */

    /* Get the exit status _without_ reaping the process, waitpid() should still work in the caller */
    if (waitid(P_PID, (id_t)src->kev.ident, &info, WEXITED | WNOHANG | WNOWAIT) < 0) {
        dbg_printf("waitid(2): %s", strerror(errno));
        return (-1);
    }

    /*
     *  Try and reconstruct the status code that would have been
     *  returned by waitpid.  The OpenBSD man pages
     *  and observations of the macOS kqueue confirm this is what
     *  we should be returning in the data field of the kevent.
     */
    switch (info.si_code) {
    case CLD_EXITED:    /* WIFEXITED - High byte contains status, low byte zeroed */
        status = info.si_status << 8;
        dbg_printf("pid=%u exited, status %u", (unsigned int)src->kev.ident, status);
        break;

    case CLD_DUMPED:    /* WIFSIGNALED/WCOREDUMP - Core flag set - Low 7 bits contains fatal signal */
        status |= 0x80; /* core flag */
        status |= info.si_status & 0x7f;
        dbg_printf("pid=%u dumped, status %u", (unsigned int)src->kev.ident, status);
        break;

    case CLD_KILLED:    /* WIFSIGNALED - Low 7 bits contains fatal signal */
        status = info.si_status & 0x7f;
        dbg_printf("pid=%u signalled, status %u", (unsigned int)src->kev.ident, status);
        break;

    default: /* The rest aren't valid exit states */
        return (0);
    }

    dst->data = status;
    dst->flags |= EV_EOF; /* Set in macOS and FreeBSD kqueue implementations */

    if (knote_copyout_flag_actions(filt, src) < 0) return -1;

    return (1);
}